

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

void server::formatsecs(vector<char> *timebuf,uint secs)

{
  uint uVar1;
  char *__s;
  bool bVar2;
  int iVar3;
  undefined8 in_RAX;
  size_t sVar4;
  long lVar5;
  undefined8 uStack_38;
  
  lVar5 = 0;
  bVar2 = false;
  uStack_38 = in_RAX;
  do {
    uVar1 = *(uint *)(timedivinfos + lVar5 + 8);
    if (secs < uVar1) {
      if (lVar5 == 0x40) {
        if (bVar2) {
          return;
        }
        goto LAB_00135a4c;
      }
    }
    else {
      if (bVar2) {
        uStack_38 = CONCAT17(0x20,(undefined7)uStack_38);
        vector<char>::add(timebuf,(char *)((long)&uStack_38 + 7));
      }
LAB_00135a4c:
      iVar3 = timebuf->ulen;
      if (timebuf->alen < iVar3 + 0xb) {
        vector<char>::growbuf(timebuf,iVar3 + 0xb);
        iVar3 = timebuf->ulen;
      }
      iVar3 = snprintf(timebuf->buf + iVar3,0xb,"%u",(ulong)secs / (ulong)uVar1);
      if (9 < iVar3) {
        iVar3 = 10;
      }
      if (iVar3 < 1) {
        iVar3 = 0;
      }
      timebuf->ulen = timebuf->ulen + iVar3;
      uStack_38._0_7_ = CONCAT16(0x20,(undefined6)uStack_38);
      vector<char>::add(timebuf,(char *)((long)&uStack_38 + 6));
      __s = *(char **)(timedivinfos + lVar5);
      sVar4 = strlen(__s);
      vector<char>::put(timebuf,__s,(int)sVar4);
      if ((int)((ulong)secs / (ulong)uVar1) != 1) {
        uStack_38._0_6_ = CONCAT15(0x73,(undefined5)uStack_38);
        vector<char>::add(timebuf,(char *)((long)&uStack_38 + 5));
      }
      if (secs % uVar1 == 0) {
        return;
      }
      bVar2 = true;
      secs = secs % uVar1;
    }
    lVar5 = lVar5 + 0x10;
    if (lVar5 == 0x50) {
      return;
    }
  } while( true );
}

Assistant:

void formatsecs(vector<char> &timebuf, uint secs)
    {
        bool moded = false;
        const size_t tl = sizeof(timedivinfos)/sizeof(timedivinfos[0]);
        for(size_t i = 0; i < tl; i++)
        {
            uint t = secs / timedivinfos[i].timediv;
            if(!t && (i+1<tl || moded)) continue;
            secs %= timedivinfos[i].timediv;
            if(moded) timebuf.add(' ');
            moded = true;
            charbuf b = timebuf.reserve(10 + 1);
            int blen = b.remaining();
            int plen = snprintf(b.buf, blen, "%u", t);
            timebuf.advance(clamp(plen, 0, blen-1));
            timebuf.add(' ');
            timebuf.put(timedivinfos[i].name, strlen(timedivinfos[i].name));
            if(t != 1) timebuf.add('s');
            if(!secs) break;
        }
    }